

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HonokaMiku.cc
# Opt level: O1

int32_t GetGameProp(char *str)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  size_t sVar5;
  uint uVar6;
  long lVar7;
  
  cVar1 = str[1];
  if ((cVar1 != '\0') && (uVar6 = 0xffffffff, str[2] != '\0')) goto LAB_00106b02;
  uVar6 = 0x30000;
  if (0xf6 < (byte)(cVar1 - 0x3aU)) {
    uVar6 = cVar1 * 0x10000 - 0x300000;
  }
  bVar2 = *str;
  if (bVar2 < 0x74) {
    if (bVar2 == 99) {
      uVar6 = uVar6 | 3;
      goto LAB_00106b02;
    }
    if (bVar2 == 0x6a) goto LAB_00106b02;
  }
  else {
    if (bVar2 == 0x74) {
      uVar6 = uVar6 | 2;
      goto LAB_00106b02;
    }
    if (bVar2 == 0x77) {
      uVar6 = uVar6 | 1;
      goto LAB_00106b02;
    }
  }
  uVar6 = 0xffffffff;
LAB_00106b02:
  if (uVar6 == 0xffffffff) {
    sVar5 = strlen(str);
    uVar6 = 0x30000;
    if (sVar5 == 9) {
      if ((int)str[8] - 0x3aU < 0xfffffff7) {
        return -1;
      }
      uVar6 = str[8] * 0x10000 - 0x300000;
    }
    lVar7 = 0;
    do {
      bVar2 = str[lVar7];
      bVar3 = bVar2 | 0x20;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        bVar3 = bVar2;
      }
      bVar2 = "sif-jp"[lVar7];
      bVar4 = bVar2 | 0x20;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        bVar4 = bVar2;
      }
    } while (((lVar7 != 5) && (bVar3 != 0)) && (lVar7 = lVar7 + 1, bVar3 == bVar4));
    if (bVar3 != bVar4) {
      lVar7 = 0;
      do {
        bVar2 = str[lVar7];
        bVar3 = bVar2 | 0x20;
        if (0x19 < (byte)(bVar2 + 0xbf)) {
          bVar3 = bVar2;
        }
        bVar2 = "sif-ww"[lVar7];
        bVar4 = bVar2 | 0x20;
        if (0x19 < (byte)(bVar2 + 0xbf)) {
          bVar4 = bVar2;
        }
      } while (((lVar7 != 5) && (bVar3 != 0)) && (lVar7 = lVar7 + 1, bVar3 == bVar4));
      if (bVar3 != bVar4) {
        lVar7 = 0;
        do {
          bVar2 = str[lVar7];
          bVar3 = bVar2 | 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar3 = bVar2;
          }
          bVar2 = "sif-en"[lVar7];
          bVar4 = bVar2 | 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar4 = bVar2;
          }
        } while (((lVar7 != 5) && (bVar3 != 0)) && (lVar7 = lVar7 + 1, bVar3 == bVar4));
        if (bVar3 != bVar4) {
          lVar7 = 0;
          do {
            bVar2 = str[lVar7];
            bVar3 = bVar2 | 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar3 = bVar2;
            }
            bVar2 = "sif-tw"[lVar7];
            bVar4 = bVar2 | 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar4 = bVar2;
            }
          } while (((lVar7 != 5) && (bVar3 != 0)) && (lVar7 = lVar7 + 1, bVar3 == bVar4));
          if (bVar3 == bVar4) {
            return uVar6 | 2;
          }
          lVar7 = 0;
          do {
            bVar2 = str[lVar7];
            bVar3 = bVar2 | 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar3 = bVar2;
            }
            bVar2 = "sif-cn"[lVar7];
            bVar4 = bVar2 | 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar4 = bVar2;
            }
          } while (((lVar7 != 5) && (bVar3 != 0)) && (lVar7 = lVar7 + 1, bVar3 == bVar4));
          if (bVar3 == bVar4) {
            return uVar6 | 3;
          }
          return -1;
        }
      }
      uVar6 = uVar6 | 1;
    }
  }
  return uVar6;
}

Assistant:

int32_t GetGameProp(const char* str)
{
	uint32_t game_prop = (-1);

	// Single character check
	if(str[1] == 0 || str[2] == 0)
	{
		uint32_t defver = (str[1] == 0 || str[1] > 57 || str[1] < 49 ? HONOKAMIKU_DECRYPT_V3 : int32_t(str[1] - 48) << 16);

		if(str[0] == 'j')
			game_prop = HONOKAMIKU_GAMETYPE_JP | defver;
		else if(str[0] == 'w')
			game_prop = HONOKAMIKU_GAMETYPE_EN | defver;
		else if(str[0] == 't')
			game_prop = HONOKAMIKU_GAMETYPE_TW | defver;
		else if(str[0] == 'c')
			game_prop = HONOKAMIKU_GAMETYPE_CN | defver;
	}

	if(game_prop != 0xFFFFFFFF)
		return game_prop;

	// Multi-character-check
	uint32_t defver = (-1);

	if(strlen(str) == 9)
	{
		defver = int32_t(str[8] - 48);

		if(defver < 1 || defver > 9)
			return (-1);
		else
			defver <<= 16;
	}
	else
		defver = HONOKAMIKU_DECRYPT_V3;

	if(msvcr110_strnicmp(str, "sif-jp", 6) == 0)
		return HONOKAMIKU_GAMETYPE_JP | defver;
	else if(
		msvcr110_strnicmp(str, "sif-ww", 6) == 0 ||
		msvcr110_strnicmp(str, "sif-en", 6) == 0
	)
		return HONOKAMIKU_GAMETYPE_EN | defver;
	else if(msvcr110_strnicmp(str, "sif-tw", 6) == 0)
		return HONOKAMIKU_GAMETYPE_TW | defver;
	else if(msvcr110_strnicmp(str, "sif-cn", 6) == 0)
		return HONOKAMIKU_GAMETYPE_CN | defver;
	
	return (-1);
}